

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

void __thiscall
libtorrent::session_stats_alert::session_stats_alert
          (session_stats_alert *this,stack_allocator *param_1,counters *cnt)

{
  rep rVar1;
  int64_t iVar2;
  int i;
  long lVar3;
  array<std::int64_t,_counters::num_counters> arr;
  int64_t local_970 [299];
  
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_0045fff0;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->super_alert).m_timestamp.__d.__r = rVar1;
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_004617a0;
  lVar3 = 0;
  do {
    iVar2 = libtorrent::counters::operator[](cnt,(int)lVar3);
    local_970[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 299);
  memcpy(&this->values,local_970,0x958);
  return;
}

Assistant:

session_stats_alert::session_stats_alert(aux::stack_allocator&, struct counters const& cnt)
		: values(counters_to_array(cnt))
	{}